

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O3

int64_t __thiscall METADemuxer::getDemuxedSize(METADemuxer *this)

{
  pointer pSVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  StreamInfo *si;
  pointer pSVar4;
  
  pSVar1 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = 0;
  for (pSVar4 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
                _M_impl.super__Vector_impl_data._M_start; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
    iVar2 = (*(pSVar4->m_streamReader->super_BaseAbstractStreamReader).
              _vptr_BaseAbstractStreamReader[3])();
    lVar3 = lVar3 + CONCAT44(extraout_var,iVar2);
  }
  return lVar3 + (this->m_containerReader).m_discardedSize;
}

Assistant:

int64_t METADemuxer::getDemuxedSize()
{
    int64_t rez = 0;
    for (const StreamInfo& si : m_codecInfo)
        rez += si.m_streamReader->getProcessedSize();  // m_codecInfo[i].m_dataProcessed;
    return rez + m_containerReader.getDiscardedSize();
}